

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::dispose
          (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this)

{
  CppTypeName *firstElement;
  RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *pRVar1;
  CppTypeName *pCVar2;
  CppTypeName *endCopy;
  CppTypeName *posCopy;
  CppTypeName *ptrCopy;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pCVar2 = this->endPtr;
  if (firstElement != (CppTypeName *)0x0) {
    this->ptr = (CppTypeName *)0x0;
    this->pos = (RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *)0x0;
    this->endPtr = (CppTypeName *)0x0;
    ArrayDisposer::dispose<capnp::(anonymous_namespace)::CppTypeName>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 6,
               (long)pCVar2 - (long)firstElement >> 6);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }